

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::AesGcmCtrV1::AesGcmCtrV1(AesGcmCtrV1 *this,AesGcmCtrV1 *other215)

{
  *(undefined ***)this = &PTR__AesGcmCtrV1_0049d7c8;
  (this->aad_prefix)._M_dataplus._M_p = (pointer)&(this->aad_prefix).field_2;
  (this->aad_prefix)._M_string_length = 0;
  (this->aad_prefix).field_2._M_local_buf[0] = '\0';
  (this->aad_file_unique)._M_dataplus._M_p = (pointer)&(this->aad_file_unique).field_2;
  (this->aad_file_unique)._M_string_length = 0;
  (this->aad_file_unique).field_2._M_local_buf[0] = '\0';
  this->__isset = (_AesGcmCtrV1__isset)((byte)this->__isset & 0xf8);
  std::__cxx11::string::_M_assign((string *)&this->aad_prefix);
  std::__cxx11::string::_M_assign((string *)&this->aad_file_unique);
  this->supply_aad_prefix = other215->supply_aad_prefix;
  this->__isset = other215->__isset;
  return;
}

Assistant:

AesGcmCtrV1::AesGcmCtrV1(const AesGcmCtrV1& other215) {
  aad_prefix = other215.aad_prefix;
  aad_file_unique = other215.aad_file_unique;
  supply_aad_prefix = other215.supply_aad_prefix;
  __isset = other215.__isset;
}